

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O2

void __thiscall NumberTemp::NumberTemp(NumberTemp *this,JitArenaAllocator *alloc,bool inLoop)

{
  HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *pHVar1;
  undefined3 in_register_00000011;
  
  TempTrackerBase::TempTrackerBase(&this->super_TempTrackerBase,alloc,inLoop);
  this->nonTempElemLoad = false;
  (this->elemLoadDependencies).head = (Type_conflict)0x0;
  (this->elemLoadDependencies).lastFoundIndex = (Type_conflict)0x0;
  (this->elemLoadDependencies).alloc = alloc;
  (this->elemLoadDependencies).lastUsedNodePrevNextField = &(this->elemLoadDependencies).head;
  (this->upwardExposedMarkTempObjectLiveFields).lastFoundIndex = (Type_conflict)0x0;
  this->upwardExposedMarkTempObjectSymsProperties =
       (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0;
  (this->upwardExposedMarkTempObjectLiveFields).head = (Type_conflict)0x0;
  (this->upwardExposedMarkTempObjectLiveFields).alloc = alloc;
  (this->upwardExposedMarkTempObjectLiveFields).lastUsedNodePrevNextField =
       &(this->upwardExposedMarkTempObjectLiveFields).head;
  if (CONCAT31(in_register_00000011,inLoop) == 0) {
    pHVar1 = (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0;
  }
  else {
    pHVar1 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::New
                       (&alloc->super_ArenaAllocator,0x10);
  }
  this->propertyIdsTempTransferDependencies = pHVar1;
  return;
}

Assistant:

NumberTemp::NumberTemp(JitArenaAllocator * alloc, bool inLoop)
    : TempTrackerBase(alloc, inLoop), elemLoadDependencies(alloc), nonTempElemLoad(false),
      upwardExposedMarkTempObjectLiveFields(alloc), upwardExposedMarkTempObjectSymsProperties(nullptr)
{
    propertyIdsTempTransferDependencies = inLoop ? HashTable<BVSparse<JitArenaAllocator> *>::New(alloc, 16) : nullptr;
}